

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::deleteRows(HighsSparseMatrix *this,HighsIndexCollection *index_collection)

{
  reference pvVar1;
  const_reference pvVar2;
  reference pvVar3;
  HighsIndexCollection *in_RSI;
  long in_RDI;
  HighsInt new_row;
  HighsInt row_4;
  HighsInt el;
  HighsInt from_el;
  HighsInt col;
  HighsInt new_num_nz;
  HighsInt row_3;
  HighsInt row_2;
  HighsInt row_1;
  HighsInt row;
  HighsInt k;
  vector<int,_std::allocator<int>_> *row_mask;
  bool mask;
  HighsInt new_num_row;
  vector<int,_std::allocator<int>_> new_index;
  HighsInt current_set_entry;
  HighsInt keep_to_row;
  HighsInt row_dim;
  HighsInt keep_from_row;
  HighsInt delete_to_row;
  HighsInt delete_from_row;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int iVar4;
  HighsInt *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  value_type vVar5;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_8c;
  int local_84;
  value_type local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_58;
  vector<int,_std::allocator<int>_> local_48;
  undefined4 local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  HighsIndexCollection *local_10;
  
  local_10 = in_RSI;
  limits(in_RSI,&local_14,&local_18);
  if (local_14 <= local_18) {
    local_28 = *(int *)(in_RDI + 8);
    local_2c = -1;
    local_30 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7e88cd);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (size_type)in_stack_ffffffffffffff38);
    local_58 = 0;
    if ((local_10->is_mask_ & 1U) == 0) {
      local_2c = -1;
      local_30 = 0;
      for (local_6c = local_14; local_6c <= local_18; local_6c = local_6c + 1) {
        updateOutInIndex((HighsIndexCollection *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (HighsInt *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         (HighsInt *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38,
                         (HighsInt *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28);
        if (local_6c == local_14) {
          for (local_70 = 0; local_70 < local_1c; local_70 = local_70 + 1) {
            in_stack_ffffffffffffff54 = local_58;
            pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_70);
            *pvVar1 = in_stack_ffffffffffffff54;
            local_58 = local_58 + 1;
          }
        }
        for (local_74 = local_1c; local_74 <= local_20; local_74 = local_74 + 1) {
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_74);
          *pvVar1 = -1;
        }
        for (local_78 = local_24; local_78 <= local_2c; local_78 = local_78 + 1) {
          in_stack_ffffffffffffff50 = local_58;
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_78);
          *pvVar1 = in_stack_ffffffffffffff50;
          local_58 = local_58 + 1;
        }
        if (local_28 + -1 <= local_2c) break;
      }
    }
    else {
      for (local_7c = 0; local_7c < *(int *)(in_RDI + 8); local_7c = local_7c + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_10->mask_,(long)local_7c)
        ;
        if (*pvVar2 == 0) {
          iVar4 = local_58;
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_7c);
          *pvVar1 = iVar4;
          local_58 = local_58 + 1;
        }
        else {
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_7c);
          *pvVar1 = -1;
        }
      }
    }
    local_80 = 0;
    for (local_84 = 0; local_84 < *(int *)(in_RDI + 4); local_84 = local_84 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_84);
      local_8c = *pvVar1;
      vVar5 = local_80;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_84);
      *pvVar1 = vVar5;
      while (in_stack_ffffffffffffff44 = local_8c,
            pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),
                                (long)(local_84 + 1)), in_stack_ffffffffffffff44 < *pvVar1) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_8c);
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)*pvVar1);
        iVar4 = *pvVar1;
        if (-1 < iVar4) {
          pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_80);
          *pvVar1 = iVar4;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                              (long)local_8c);
          in_stack_ffffffffffffff38 = (HighsInt *)*pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                              (long)local_80);
          *pvVar3 = (value_type)in_stack_ffffffffffffff38;
          local_80 = local_80 + 1;
          in_stack_ffffffffffffff34 = iVar4;
        }
        local_8c = local_8c + 1;
      }
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),
                        (long)*(int *)(in_RDI + 4));
    *pvVar1 = local_80;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (size_type)in_stack_ffffffffffffff38);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (size_type)in_stack_ffffffffffffff38);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (size_type)in_stack_ffffffffffffff38);
    *(int *)(in_RDI + 8) = local_58;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  return;
}

Assistant:

void HighsSparseMatrix::deleteRows(
    const HighsIndexCollection& index_collection) {
  assert(this->formatOk());
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  HighsInt delete_from_row;
  HighsInt delete_to_row;
  HighsInt keep_from_row;
  HighsInt row_dim = this->num_row_;
  HighsInt keep_to_row = -1;
  HighsInt current_set_entry = 0;

  // Set up a row mask to indicate the new row index of kept rows and
  // -1 for deleted rows so that the kept entries in the column-wise
  // matrix can be identified and have their correct row index.
  vector<HighsInt> new_index;
  new_index.resize(this->num_row_);
  HighsInt new_num_row = 0;
  bool mask = index_collection.is_mask_;
  const vector<HighsInt>& row_mask = index_collection.mask_;
  if (!mask) {
    keep_to_row = -1;
    current_set_entry = 0;
    for (HighsInt k = from_k; k <= to_k; k++) {
      updateOutInIndex(index_collection, delete_from_row, delete_to_row,
                       keep_from_row, keep_to_row, current_set_entry);
      if (k == from_k) {
        // Account for any initial rows being kept
        for (HighsInt row = 0; row < delete_from_row; row++) {
          new_index[row] = new_num_row;
          new_num_row++;
        }
      }
      for (HighsInt row = delete_from_row; row <= delete_to_row; row++) {
        new_index[row] = -1;
      }
      for (HighsInt row = keep_from_row; row <= keep_to_row; row++) {
        new_index[row] = new_num_row;
        new_num_row++;
      }
      if (keep_to_row >= row_dim - 1) break;
    }
  } else {
    for (HighsInt row = 0; row < this->num_row_; row++) {
      if (row_mask[row]) {
        new_index[row] = -1;
      } else {
        new_index[row] = new_num_row;
        new_num_row++;
      }
    }
  }
  HighsInt new_num_nz = 0;
  for (HighsInt col = 0; col < this->num_col_; col++) {
    HighsInt from_el = this->start_[col];
    this->start_[col] = new_num_nz;
    for (HighsInt el = from_el; el < this->start_[col + 1]; el++) {
      HighsInt row = this->index_[el];
      HighsInt new_row = new_index[row];
      if (new_row >= 0) {
        this->index_[new_num_nz] = new_row;
        this->value_[new_num_nz] = this->value_[el];
        new_num_nz++;
      }
    }
  }
  this->start_[this->num_col_] = new_num_nz;
  this->start_.resize(this->num_col_ + 1);
  this->index_.resize(new_num_nz);
  this->value_.resize(new_num_nz);
  // Update the number of rows
  this->num_row_ = new_num_row;
}